

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O0

void Fxu_ListVarDelLiteral(Fxu_Var *pVar,Fxu_Lit *pLink)

{
  Fxu_ListLit *pList;
  Fxu_Lit *pLink_local;
  Fxu_Var *pVar_local;
  
  if ((pVar->lLits).pHead == pLink) {
    (pVar->lLits).pHead = pLink->pVNext;
  }
  if ((pVar->lLits).pTail == pLink) {
    (pVar->lLits).pTail = pLink->pVPrev;
  }
  if (pLink->pVPrev != (Fxu_Lit *)0x0) {
    pLink->pVPrev->pVNext = pLink->pVNext;
  }
  if (pLink->pVNext != (Fxu_Lit *)0x0) {
    pLink->pVNext->pVPrev = pLink->pVPrev;
  }
  (pVar->lLits).nItems = (pVar->lLits).nItems + -1;
  return;
}

Assistant:

void Fxu_ListVarDelLiteral( Fxu_Var * pVar, Fxu_Lit * pLink )
{
	Fxu_ListLit * pList = &(pVar->lLits);
	if ( pList->pHead == pLink )
		 pList->pHead = pLink->pVNext;
	if ( pList->pTail == pLink )
		 pList->pTail = pLink->pVPrev;
	if ( pLink->pVPrev )
		 pLink->pVPrev->pVNext = pLink->pVNext;
	if ( pLink->pVNext )
		 pLink->pVNext->pVPrev = pLink->pVPrev;
	pList->nItems--;
}